

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseTextDecl(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  xmlParserInputState xVar2;
  xmlParserInputPtr pxVar3;
  int iVar4;
  xmlChar *pxVar5;
  
  pxVar3 = ctxt->input;
  pxVar5 = pxVar3->cur;
  if (((((*pxVar5 != '<') || (pxVar5[1] != '?')) || (pxVar5[2] != 'x')) ||
      ((pxVar5[3] != 'm' || (pxVar5[4] != 'l')))) ||
     ((0x20 < (ulong)pxVar5[5] || ((0x100002600U >> ((ulong)pxVar5[5] & 0x3f) & 1) == 0)))) {
    xmlFatalErr(ctxt,XML_ERR_XMLDECL_NOT_STARTED,(char *)0x0);
    return;
  }
  pxVar3->cur = pxVar5 + 5;
  pxVar3->col = pxVar3->col + 5;
  if (pxVar5[5] == '\0') {
    xmlParserInputGrow(pxVar3,0xfa);
  }
  xVar2 = ctxt->instate;
  ctxt->instate = XML_PARSER_START;
  iVar4 = xmlSkipBlankChars(ctxt);
  if (iVar4 == 0) {
    xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space needed after \'<?xml\'\n");
  }
  pxVar5 = xmlParseVersionInfo(ctxt);
  if (pxVar5 == (xmlChar *)0x0) {
    pxVar5 = xmlCharStrdup("1.0");
  }
  else {
    iVar4 = xmlSkipBlankChars(ctxt);
    if (iVar4 == 0) {
      xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space needed here\n");
    }
  }
  ctxt->input->version = pxVar5;
  pxVar5 = xmlParseEncodingDecl(ctxt);
  if (ctxt->errNo != 0x20) {
    if (ctxt->errNo == 0 && pxVar5 == (xmlChar *)0x0) {
      xmlFatalErrMsg(ctxt,XML_ERR_MISSING_ENCODING,"Missing encoding in text declaration\n");
    }
    xmlSkipBlankChars(ctxt);
    pxVar3 = ctxt->input;
    pxVar5 = pxVar3->cur;
    if (*pxVar5 == '>') {
      xmlFatalErr(ctxt,XML_ERR_XMLDECL_NOT_FINISHED,(char *)0x0);
      xmlNextChar(ctxt);
    }
    else if ((*pxVar5 == '?') && (pxVar5[1] == '>')) {
      pxVar3->cur = pxVar5 + 2;
      pxVar3->col = pxVar3->col + 2;
      if (pxVar5[2] == '\0') {
        xmlParserInputGrow(pxVar3,0xfa);
      }
    }
    else {
      xmlFatalErr(ctxt,XML_ERR_XMLDECL_NOT_FINISHED,(char *)0x0);
      do {
        xVar1 = *ctxt->input->cur;
        if (xVar1 == '\0') break;
        xmlNextChar(ctxt);
      } while (xVar1 != '>');
    }
  }
  ctxt->instate = xVar2;
  return;
}

Assistant:

void
xmlParseTextDecl(xmlParserCtxtPtr ctxt) {
    xmlChar *version;
    const xmlChar *encoding;
    int oldstate;

    /*
     * We know that '<?xml' is here.
     */
    if ((CMP5(CUR_PTR, '<', '?', 'x', 'm', 'l')) && (IS_BLANK_CH(NXT(5)))) {
	SKIP(5);
    } else {
	xmlFatalErr(ctxt, XML_ERR_XMLDECL_NOT_STARTED, NULL);
	return;
    }

    /* Avoid expansion of parameter entities when skipping blanks. */
    oldstate = ctxt->instate;
    ctxt->instate = XML_PARSER_START;

    if (SKIP_BLANKS == 0) {
	xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		       "Space needed after '<?xml'\n");
    }

    /*
     * We may have the VersionInfo here.
     */
    version = xmlParseVersionInfo(ctxt);
    if (version == NULL)
	version = xmlCharStrdup(XML_DEFAULT_VERSION);
    else {
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		           "Space needed here\n");
	}
    }
    ctxt->input->version = version;

    /*
     * We must have the encoding declaration
     */
    encoding = xmlParseEncodingDecl(ctxt);
    if (ctxt->errNo == XML_ERR_UNSUPPORTED_ENCODING) {
	/*
	 * The XML REC instructs us to stop parsing right here
	 */
        ctxt->instate = oldstate;
        return;
    }
    if ((encoding == NULL) && (ctxt->errNo == XML_ERR_OK)) {
	xmlFatalErrMsg(ctxt, XML_ERR_MISSING_ENCODING,
		       "Missing encoding in text declaration\n");
    }

    SKIP_BLANKS;
    if ((RAW == '?') && (NXT(1) == '>')) {
        SKIP(2);
    } else if (RAW == '>') {
        /* Deprecated old WD ... */
	xmlFatalErr(ctxt, XML_ERR_XMLDECL_NOT_FINISHED, NULL);
	NEXT;
    } else {
        int c;

	xmlFatalErr(ctxt, XML_ERR_XMLDECL_NOT_FINISHED, NULL);
        while ((c = CUR) != 0) {
            NEXT;
            if (c == '>')
                break;
        }
    }

    ctxt->instate = oldstate;
}